

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O0

lzma_ret block_encode_uncompressed
                   (lzma_block *block,uint8_t *in,size_t in_size,uint8_t *out,size_t *out_pos,
                   size_t out_size)

{
  lzma_filter *plVar1;
  uint64_t uVar2;
  size_t sVar3;
  lzma_ret lVar4;
  uint64_t uVar5;
  size_t local_108;
  size_t copy_size;
  ulong uStack_e8;
  uint8_t control;
  size_t in_pos;
  lzma_filter *filters_orig;
  lzma_filter filters [2];
  undefined4 local_b0 [2];
  lzma_options_lzma lzma2;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  size_t in_size_local;
  uint8_t *in_local;
  lzma_block *block_local;
  
  lzma2.reserved_ptr2 = (void *)out_size;
  memset(local_b0,0,0x70);
  local_b0[0] = 0x1000;
  filters_orig = (lzma_filter *)0x21;
  filters[0].id = (lzma_vli)local_b0;
  filters[0].options = (void *)0xffffffffffffffff;
  plVar1 = block->filters;
  block->filters = (lzma_filter *)&filters_orig;
  lVar4 = lzma_block_header_size(block);
  if (lVar4 == LZMA_OK) {
    uVar2 = block->compressed_size;
    uVar5 = lzma2_bound(in_size);
    if (uVar2 != uVar5) {
      __assert_fail("block->compressed_size == lzma2_bound(in_size)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                    ,0x77,
                    "lzma_ret block_encode_uncompressed(lzma_block *, const uint8_t *, size_t, uint8_t *, size_t *, size_t)"
                   );
    }
    if ((long)lzma2.reserved_ptr2 - *out_pos < (ulong)block->header_size + block->compressed_size) {
      block->filters = plVar1;
      block_local._4_4_ = LZMA_BUF_ERROR;
    }
    else {
      lVar4 = lzma_block_header_encode(block,out + *out_pos);
      if (lVar4 == LZMA_OK) {
        block->filters = plVar1;
        *out_pos = (ulong)block->header_size + *out_pos;
        uStack_e8 = 0;
        copy_size._7_1_ = '\x01';
        while (uStack_e8 < in_size) {
          sVar3 = *out_pos;
          *out_pos = sVar3 + 1;
          out[sVar3] = copy_size._7_1_;
          copy_size._7_1_ = '\x02';
          if (in_size - uStack_e8 < 0x10000) {
            local_108 = in_size - uStack_e8;
          }
          else {
            local_108 = 0x10000;
          }
          sVar3 = *out_pos;
          *out_pos = sVar3 + 1;
          out[sVar3] = (uint8_t)(local_108 - 1 >> 8);
          sVar3 = *out_pos;
          *out_pos = sVar3 + 1;
          out[sVar3] = (char)local_108 + 0xff;
          if (lzma2.reserved_ptr2 < (void *)(*out_pos + local_108)) {
            __assert_fail("*out_pos + copy_size <= out_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                          ,0x97,
                          "lzma_ret block_encode_uncompressed(lzma_block *, const uint8_t *, size_t, uint8_t *, size_t *, size_t)"
                         );
          }
          memcpy(out + *out_pos,in + uStack_e8,local_108);
          uStack_e8 = local_108 + uStack_e8;
          *out_pos = local_108 + *out_pos;
        }
        sVar3 = *out_pos;
        *out_pos = sVar3 + 1;
        out[sVar3] = '\0';
        if (lzma2.reserved_ptr2 < (void *)*out_pos) {
          __assert_fail("*out_pos <= out_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                        ,0xa0,
                        "lzma_ret block_encode_uncompressed(lzma_block *, const uint8_t *, size_t, uint8_t *, size_t *, size_t)"
                       );
        }
        block_local._4_4_ = LZMA_OK;
      }
      else {
        block->filters = plVar1;
        block_local._4_4_ = LZMA_PROG_ERROR;
      }
    }
  }
  else {
    block->filters = plVar1;
    block_local._4_4_ = LZMA_PROG_ERROR;
  }
  return block_local._4_4_;
}

Assistant:

static lzma_ret
block_encode_uncompressed(lzma_block *block, const uint8_t *in, size_t in_size,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	// Use LZMA2 uncompressed chunks. We wouldn't need a dictionary at
	// all, but LZMA2 always requires a dictionary, so use the minimum
	// value to minimize memory usage of the decoder.
	lzma_options_lzma lzma2 = {
		.dict_size = LZMA_DICT_SIZE_MIN,
	};

	lzma_filter filters[2];
	filters[0].id = LZMA_FILTER_LZMA2;
	filters[0].options = &lzma2;
	filters[1].id = LZMA_VLI_UNKNOWN;

	// Set the above filter options to *block temporarily so that we can
	// encode the Block Header.
	lzma_filter *filters_orig = block->filters;
	block->filters = filters;

	if (lzma_block_header_size(block) != LZMA_OK) {
		block->filters = filters_orig;
		return LZMA_PROG_ERROR;
	}

	// Check that there's enough output space. The caller has already
	// set block->compressed_size to what lzma2_bound() has returned,
	// so we can reuse that value. We know that compressed_size is a
	// known valid VLI and header_size is a small value so their sum
	// will never overflow.
	assert(block->compressed_size == lzma2_bound(in_size));
	if (out_size - *out_pos
			< block->header_size + block->compressed_size) {
		block->filters = filters_orig;
		return LZMA_BUF_ERROR;
	}

	if (lzma_block_header_encode(block, out + *out_pos) != LZMA_OK) {
		block->filters = filters_orig;
		return LZMA_PROG_ERROR;
	}

	block->filters = filters_orig;
	*out_pos += block->header_size;

	// Encode the data using LZMA2 uncompressed chunks.
	size_t in_pos = 0;
	uint8_t control = 0x01; // Dictionary reset

	while (in_pos < in_size) {
		// Control byte: Indicate uncompressed chunk, of which
		// the first resets the dictionary.
		out[(*out_pos)++] = control;
		control = 0x02; // No dictionary reset

		// Size of the uncompressed chunk
		const size_t copy_size
				= my_min(in_size - in_pos, LZMA2_CHUNK_MAX);
		out[(*out_pos)++] = (copy_size - 1) >> 8;
		out[(*out_pos)++] = (copy_size - 1) & 0xFF;

		// The actual data
		assert(*out_pos + copy_size <= out_size);
		memcpy(out + *out_pos, in + in_pos, copy_size);

		in_pos += copy_size;
		*out_pos += copy_size;
	}

	// End marker
	out[(*out_pos)++] = 0x00;
	assert(*out_pos <= out_size);

	return LZMA_OK;
}